

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ls.h
# Opt level: O3

void __thiscall wabt::LoadStoreTracking::Track(LoadStoreTracking *this,Node *n)

{
  uint uVar1;
  pointer pNVar2;
  char *__function;
  Opcode opc;
  Expr *pEVar3;
  Node *c;
  pointer n_00;
  Enum local_50;
  Enum local_48;
  
  pNVar2 = (n->children).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (n_00 = (n->children).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
              super__Vector_impl_data._M_start; n_00 != pNVar2; n_00 = n_00 + 1) {
    Track(this,n_00);
  }
  if (n->etype == Load) {
    pEVar3 = n->e;
    if (pEVar3->type_ != Load) {
      __function = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::LoadStoreExpr<wabt::ExprType::Load>, Base = wabt::Expr]"
      ;
      goto LAB_00147a4a;
    }
    opc.enum_ = *(Enum *)&pEVar3->field_0x3c;
    uVar1 = *(uint *)((long)&pEVar3[1]._vptr_Expr + 4);
    Opcode::GetInfo((Opcode *)&pEVar3->field_0x3c);
    local_48 = local_50;
  }
  else {
    if (n->etype != Store) {
      return;
    }
    pEVar3 = n->e;
    if (pEVar3->type_ != Store) {
      __function = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::LoadStoreExpr<wabt::ExprType::Store>, Base = wabt::Expr]"
      ;
LAB_00147a4a:
      __assert_fail("isa<Derived>(base)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/cast.h"
                    ,0x48,__function);
    }
    opc.enum_ = *(Enum *)&pEVar3->field_0x3c;
    uVar1 = *(uint *)((long)&pEVar3[1]._vptr_Expr + 4);
    Opcode::GetInfo((Opcode *)&pEVar3->field_0x3c);
  }
  LoadStore(this,(ulong)uVar1,opc,(Type)local_48,*(Address *)&pEVar3[1]._vptr_Expr,
            (n->children).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
            super__Vector_impl_data._M_start);
  return;
}

Assistant:

void Track(const Node& n) {
    for (auto& c : n.children) Track(c);
    switch (n.etype) {
      case ExprType::Load: {
        auto& le = *cast<LoadExpr>(n.e);
        LoadStore(le.offset, le.opcode, le.opcode.GetResultType(),
                  le.align, n.children[0]);
        break;
      }
      case ExprType::Store: {
        auto& se = *cast<StoreExpr>(n.e);
        LoadStore(se.offset, se.opcode, se.opcode.GetParamType2(),
                  se.align, n.children[0]);
        break;
      }
      default:
        break;
    }
  }